

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::bitcast_expression_abi_cxx11_
          (CompilerGLSL *this,BaseType target_type,uint32_t arg)

{
  SPIRType *pSVar1;
  uint32_t in_ECX;
  undefined4 in_register_00000034;
  Compiler *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0 [32];
  spirv_cross local_1b0 [32];
  undefined1 local_190 [8];
  SPIRType target;
  SPIRType *src_type;
  uint32_t arg_local;
  BaseType target_type_local;
  CompilerGLSL *this_local;
  string *expr;
  
  this_00 = (Compiler *)CONCAT44(in_register_00000034,target_type);
  to_expression_abi_cxx11_(this,target_type,SUB41(in_ECX,0));
  pSVar1 = Compiler::expression_type(this_00,in_ECX);
  if (*(uint32_t *)&(pSVar1->super_IVariant).field_0xc != arg) {
    SPIRType::SPIRType((SPIRType *)local_190,pSVar1);
    target.super_IVariant._vptr_IVariant._4_4_ = arg;
    (*this_00->_vptr_Compiler[0x38])(local_1d0,this_00,local_190,pSVar1);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (local_1b0,local_1d0,(char (*) [2])0x5cba12,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (char (*) [2])0x5b48c4);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_1b0);
    ::std::__cxx11::string::~string((string *)local_1b0);
    ::std::__cxx11::string::~string((string *)local_1d0);
    SPIRType::~SPIRType((SPIRType *)local_190);
  }
  return this;
}

Assistant:

std::string CompilerGLSL::bitcast_expression(SPIRType::BaseType target_type, uint32_t arg)
{
	auto expr = to_expression(arg);
	auto &src_type = expression_type(arg);
	if (src_type.basetype != target_type)
	{
		auto target = src_type;
		target.basetype = target_type;
		expr = join(bitcast_glsl_op(target, src_type), "(", expr, ")");
	}

	return expr;
}